

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

uint32_t get_rng_seed(uint32_t seed)

{
  int iVar1;
  rep rVar2;
  result_type_conflict1 in_EDI;
  double dVar3;
  random_device rd;
  random_device *in_stack_ffffffffffffd900;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_13b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_13a8 [628];
  result_type_conflict1 local_4;
  
  local_4 = in_EDI;
  if (in_EDI == 0xffffffff) {
    if ((get_rng_seed(unsigned_int)::is_rd_prng == '\0') &&
       (iVar1 = __cxa_guard_acquire(&get_rng_seed(unsigned_int)::is_rd_prng), iVar1 != 0)) {
      std::random_device::random_device(in_stack_ffffffffffffd900);
      dVar3 = std::random_device::entropy((random_device *)0x517462);
      std::random_device::~random_device((random_device *)0x517482);
      get_rng_seed::is_rd_prng = dVar3 == 0.0;
      __cxa_guard_release(&get_rng_seed(unsigned_int)::is_rd_prng);
    }
    if ((get_rng_seed::is_rd_prng & 1U) == 0) {
      std::random_device::random_device(in_stack_ffffffffffffd900);
      local_4 = std::random_device::operator()((random_device *)0x517517);
      std::random_device::~random_device((random_device *)0x517532);
    }
    else {
      local_13b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_13a8[0].__r =
           (rep)std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ::time_since_epoch(&local_13b0);
      rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_13a8);
      local_4 = (result_type_conflict1)rVar2;
    }
  }
  return local_4;
}

Assistant:

static uint32_t get_rng_seed(uint32_t seed) {
    if (seed == LLAMA_DEFAULT_SEED) {
        // use system clock if std::random_device is not a true RNG
        static bool is_rd_prng = std::random_device().entropy() == 0;
        if (is_rd_prng) {
            return (uint32_t) std::chrono::system_clock::now().time_since_epoch().count();
        }
        std::random_device rd;
        return rd();
    }
    return seed;
}